

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O2

int __thiscall Configurator::configure(Configurator *this,string *hmhome)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)hmhome);
  configure_home_path(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  print_configuaration(this);
  return 0;
}

Assistant:

int configure(const std::string hmhome) {
    configure_home_path(hmhome);
    print_configuaration();
    return 0;
  }